

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ostream * Catch::operator<<(ostream *os,LazyExpression *lazyExpr)

{
  ITransientExpression *pIVar1;
  ostream *poVar2;
  
  if (lazyExpr->m_isNegated == true) {
    std::operator<<(os,'!');
  }
  pIVar1 = lazyExpr->m_transientExpression;
  if (pIVar1 == (ITransientExpression *)0x0) {
    std::operator<<(os,"{** error - unchecked empty expression requested **}");
  }
  else if ((lazyExpr->m_isNegated == true) && (pIVar1->m_isBinaryExpression == true)) {
    poVar2 = std::operator<<(os,'(');
    (**lazyExpr->m_transientExpression->_vptr_ITransientExpression)
              (lazyExpr->m_transientExpression,poVar2);
    std::operator<<(poVar2,')');
  }
  else {
    (**pIVar1->_vptr_ITransientExpression)(pIVar1,os);
  }
  return os;
}

Assistant:

auto operator << (std::ostream& os, LazyExpression const& lazyExpr) -> std::ostream& {
        if (lazyExpr.m_isNegated)
            os << '!';

        if (lazyExpr) {
            if (lazyExpr.m_isNegated && lazyExpr.m_transientExpression->isBinaryExpression())
                os << '(' << *lazyExpr.m_transientExpression << ')';
            else
                os << *lazyExpr.m_transientExpression;
        } else {
            os << "{** error - unchecked empty expression requested **}";
        }
        return os;
    }